

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomShaderProgram.cpp
# Opt level: O1

void __thiscall
deqp::gls::RandomShaderProgram::shadeVertices
          (RandomShaderProgram *this,VertexAttrib *inputs,VertexPacket **packets,int numPackets)

{
  VertexAttrib *vertexAttrib;
  int iVar1;
  VertexPacket *pVVar2;
  float fVar3;
  ExecutionContext *this_00;
  pointer ppSVar4;
  VariableType *pVVar5;
  pointer ppVVar6;
  int iVar7;
  uint uVar8;
  Scalar *pSVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  Shader *this_01;
  ulong uVar13;
  ExecValueAccess EVar14;
  Vec4 attribValue;
  Vec4 local_58;
  ulong local_40;
  VertexAttrib *local_38;
  
  local_38 = inputs;
  refreshUniforms(this);
  if (0 < numPackets) {
    this_00 = &this->m_execCtx;
    local_40 = 0;
    do {
      iVar7 = (int)local_40;
      uVar11 = numPackets - iVar7;
      uVar8 = 0x40;
      if ((int)uVar11 < 0x40) {
        uVar8 = uVar11;
      }
      this_01 = this->m_vertexShader;
      ppSVar4 = (this_01->m_inputs).
                super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (0 < (int)((ulong)((long)(this_01->m_inputs).
                                  super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar4) >> 3))
      {
        uVar12 = 1;
        if (1 < (int)uVar8) {
          uVar12 = (ulong)uVar8;
        }
        lVar10 = 0;
        do {
          iVar1 = (ppSVar4[lVar10]->m_variable->m_type).m_numElements;
          EVar14 = rsg::ExecutionContext::getValue(this_00,ppSVar4[lVar10]->m_variable);
          pSVar9 = EVar14.super_ConstStridedValueAccess<64>.m_value;
          pVVar5 = EVar14.super_ConstStridedValueAccess<64>.m_type;
          if (0 < (int)uVar11) {
            vertexAttrib = local_38 + lVar10;
            uVar13 = 0;
            do {
              local_58.m_data[0] = 0.0;
              local_58.m_data[1] = 0.0;
              local_58.m_data[2] = 0.0;
              local_58.m_data[3] = 0.0;
              rr::readVertexAttrib
                        (&local_58,vertexAttrib,packets[iVar7 + (int)uVar13]->instanceNdx,
                         packets[iVar7 + (int)uVar13]->vertexNdx);
              fVar3 = local_58.m_data[0];
              rsg::VariableType::getElementType(pVVar5);
              pSVar9[uVar13].intVal = (int)fVar3;
              if (1 < iVar1) {
                fVar3 = local_58.m_data[1];
                rsg::VariableType::getElementType(pVVar5);
                pSVar9[uVar13 + 0x40].intVal = (int)fVar3;
              }
              if (2 < iVar1) {
                fVar3 = local_58.m_data[2];
                rsg::VariableType::getElementType(pVVar5);
                pSVar9[uVar13 + 0x80].intVal = (int)fVar3;
              }
              if (3 < iVar1) {
                fVar3 = local_58.m_data[3];
                rsg::VariableType::getElementType(pVVar5);
                pSVar9[uVar13 + 0xc0].intVal = (int)fVar3;
              }
              uVar13 = uVar13 + 1;
            } while (uVar12 != uVar13);
          }
          lVar10 = lVar10 + 1;
          this_01 = this->m_vertexShader;
          ppSVar4 = (this_01->m_inputs).
                    super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        } while (lVar10 < (int)((ulong)((long)(this_01->m_inputs).
                                              super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)ppSVar4) >> 3));
      }
      rsg::Shader::execute(this_01,this_00);
      EVar14 = rsg::ExecutionContext::getValue(this_00,this->m_positionVar);
      pSVar9 = EVar14.super_ConstStridedValueAccess<64>.m_value;
      pVVar5 = EVar14.super_ConstStridedValueAccess<64>.m_type;
      if (0 < (int)uVar11) {
        uVar12 = 1;
        if (1 < (int)uVar8) {
          uVar12 = (ulong)uVar8;
        }
        uVar13 = 0;
        do {
          pVVar2 = packets[iVar7 + (int)uVar13];
          rsg::VariableType::getElementType(pVVar5);
          (pVVar2->position).m_data[0] = (float)pSVar9[uVar13];
          rsg::VariableType::getElementType(pVVar5);
          *(Scalar *)((pVVar2->position).m_data + 1) = pSVar9[uVar13 + 0x40];
          rsg::VariableType::getElementType(pVVar5);
          *(Scalar *)((pVVar2->position).m_data + 2) = pSVar9[uVar13 + 0x80];
          rsg::VariableType::getElementType(pVVar5);
          *(Scalar *)((pVVar2->position).m_data + 3) = pSVar9[uVar13 + 0xc0];
          uVar13 = uVar13 + 1;
        } while (uVar12 != uVar13);
      }
      ppVVar6 = (this->m_vertexOutputs).
                super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (0 < (int)((ulong)((long)(this->m_vertexOutputs).
                                  super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar6) >> 3))
      {
        uVar12 = 1;
        if (1 < (int)uVar8) {
          uVar12 = (ulong)uVar8;
        }
        lVar10 = 0;
        do {
          iVar1 = (ppVVar6[lVar10]->m_type).m_numElements;
          EVar14 = rsg::ExecutionContext::getValue(this_00,ppVVar6[lVar10]);
          pSVar9 = EVar14.super_ConstStridedValueAccess<64>.m_value;
          pVVar5 = EVar14.super_ConstStridedValueAccess<64>.m_type;
          if (0 < (int)uVar11) {
            uVar13 = 0;
            do {
              pVVar2 = packets[(int)uVar13 + iVar7];
              rsg::VariableType::getElementType(pVVar5);
              *(Scalar *)(pVVar2->outputs + lVar10) = pSVar9[uVar13];
              if (1 < iVar1) {
                rsg::VariableType::getElementType(pVVar5);
                *(Scalar *)(pVVar2->outputs[lVar10].v.uData + 1) = pSVar9[uVar13 + 0x40];
              }
              if (2 < iVar1) {
                rsg::VariableType::getElementType(pVVar5);
                *(Scalar *)(pVVar2->outputs[lVar10].v.uData + 2) = pSVar9[uVar13 + 0x80];
              }
              if (3 < iVar1) {
                rsg::VariableType::getElementType(pVVar5);
                *(Scalar *)(pVVar2->outputs[lVar10].v.uData + 3) = pSVar9[uVar13 + 0xc0];
              }
              uVar13 = uVar13 + 1;
            } while (uVar12 != uVar13);
          }
          lVar10 = lVar10 + 1;
          ppVVar6 = (this->m_vertexOutputs).
                    super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (lVar10 < (int)((ulong)((long)(this->m_vertexOutputs).
                                              super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)ppVVar6) >> 3));
      }
      uVar8 = (int)local_40 + uVar8;
      local_40 = (ulong)uVar8;
    } while ((int)uVar8 < numPackets);
  }
  return;
}

Assistant:

void RandomShaderProgram::shadeVertices (const rr::VertexAttrib* inputs, rr::VertexPacket* const* packets, const int numPackets) const
{
	// \todo [2013-12-13 pyry] Do only when necessary.
	refreshUniforms();

	int packetOffset = 0;

	while (packetOffset < numPackets)
	{
		const int	numToExecute	= de::min(numPackets-packetOffset, (int)rsg::EXEC_VEC_WIDTH);

		// Fetch attributes.
		for (int attribNdx = 0; attribNdx < (int)m_vertexShader.getInputs().size(); ++attribNdx)
		{
			const rsg::Variable*		attribVar		= m_vertexShader.getInputs()[attribNdx]->getVariable();
			const rsg::VariableType&	attribType		= attribVar->getType();
			const int					numComponents	= attribType.getNumElements();
			rsg::ExecValueAccess		access			= m_execCtx.getValue(attribVar);

			DE_ASSERT(attribType.isFloatOrVec() && de::inRange(numComponents, 1, 4));

			for (int ndx = 0; ndx < numToExecute; ndx++)
			{
				const int				packetNdx	= ndx+packetOffset;
				const rr::VertexPacket*	packet		= packets[packetNdx];
				const tcu::Vec4			attribValue	= rr::readVertexAttribFloat(inputs[attribNdx], packet->instanceNdx, packet->vertexNdx);

										access.component(0).asFloat(ndx) = attribValue[0];
				if (numComponents >= 2)	access.component(1).asFloat(ndx) = attribValue[1];
				if (numComponents >= 3)	access.component(2).asFloat(ndx) = attribValue[2];
				if (numComponents >= 4)	access.component(3).asFloat(ndx) = attribValue[3];
			}
		}

		m_vertexShader.execute(m_execCtx);

		// Store position
		{
			const rsg::ExecConstValueAccess	access	= m_execCtx.getValue(m_positionVar);

			for (int ndx = 0; ndx < numToExecute; ndx++)
			{
				const int			packetNdx	= ndx+packetOffset;
				rr::VertexPacket*	packet		= packets[packetNdx];

				packet->position[0] = access.component(0).asFloat(ndx);
				packet->position[1] = access.component(1).asFloat(ndx);
				packet->position[2] = access.component(2).asFloat(ndx);
				packet->position[3] = access.component(3).asFloat(ndx);
			}
		}

		// Other varyings
		for (int varNdx = 0; varNdx < (int)m_vertexOutputs.size(); varNdx++)
		{
			const rsg::Variable*			var				= m_vertexOutputs[varNdx];
			const rsg::VariableType&		varType			= var->getType();
			const int						numComponents	= varType.getNumElements();
			const rsg::ExecConstValueAccess	access			= m_execCtx.getValue(var);

			DE_ASSERT(varType.isFloatOrVec() && de::inRange(numComponents, 1, 4));

			for (int ndx = 0; ndx < numToExecute; ndx++)
			{
				const int				packetNdx	= ndx+packetOffset;
				rr::VertexPacket* const	packet		= packets[packetNdx];
				float* const			dst			= packet->outputs[varNdx].getAccess<float>();

										dst[0] = access.component(0).asFloat(ndx);
				if (numComponents >= 2) dst[1] = access.component(1).asFloat(ndx);
				if (numComponents >= 3) dst[2] = access.component(2).asFloat(ndx);
				if (numComponents >= 4) dst[3] = access.component(3).asFloat(ndx);
			}
		}

		packetOffset += numToExecute;
	}
}